

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SingleBindingCase::SingleBindingCase
          (SingleBindingCase *this,Context *ctx,char *name,int flags)

{
  bool unalignedData;
  char *desc;
  string local_48;
  int local_24;
  char *pcStack_20;
  int flags_local;
  char *name_local;
  Context *ctx_local;
  SingleBindingCase *this_local;
  
  local_24 = flags;
  pcStack_20 = name;
  name_local = (char *)ctx;
  ctx_local = (Context *)this;
  Functional::(anonymous_namespace)::SingleBindingCase::genTestDescription_abi_cxx11_
            (&local_48,(SingleBindingCase *)(ulong)(uint)flags,(int)name);
  desc = (char *)std::__cxx11::string::c_str();
  unalignedData = isDataUnaligned(local_24);
  BindingRenderCase::BindingRenderCase(&this->super_BindingRenderCase,ctx,name,desc,unalignedData);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleBindingCase_032c8db8;
  genTestSpec(&this->m_spec,local_24);
  this->m_buf = 0;
  return;
}

Assistant:

SingleBindingCase::SingleBindingCase (Context& ctx, const char* name, int flags)
	: BindingRenderCase	(ctx, name, genTestDescription(flags).c_str(), isDataUnaligned(flags))
	, m_spec			(genTestSpec(flags))
	, m_buf				(0)
{
	DE_ASSERT(!((flags & FLAG_ATTRIB_UNALIGNED) && (flags & FLAG_ATTRIB_ALIGNED)));
	DE_ASSERT(!((flags & FLAG_ATTRIB_ALIGNED) && (flags & FLAG_BUF_UNALIGNED_STRIDE)));

	DE_ASSERT(!isDataUnaligned(flags));
}